

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::X<double>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,TPZFMatrix<double> *coord,
          TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  TPZVec<double> *in_RCX;
  long in_RDI;
  double dVar5;
  int i_1;
  int i;
  double norm;
  TPZManVector<double,_3> xqsiLxc;
  TPZManVector<double,_3> xqsi;
  TPZVec<double> *in_stack_00000b88;
  TPZVec<double> *in_stack_00000b90;
  TPZFMatrix<double> *in_stack_00000b98;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_00000ba0;
  TPZManVector<double,_3> *in_stack_fffffffffffffed0;
  double *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  TPZManVector<double,_3> *in_stack_ffffffffffffff00;
  int local_c0;
  int local_bc;
  double local_b8;
  TPZVec<double> local_98;
  undefined8 local_60;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  
  local_60 = 0;
  local_20 = in_RCX;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<double>
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90,in_stack_00000b88);
  local_b8 = 0.0;
  for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
    pdVar4 = TPZVec<double>::operator[](&local_58,(long)local_bc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xa88),(long)local_bc);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_bc);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_bc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_bc);
    local_b8 = dVar5 * *pdVar4 + local_b8;
  }
  dVar5 = sqrt(local_b8);
  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xa88),(long)local_c0);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_c0);
    dVar2 = *pdVar4;
    dVar3 = *(double *)(in_RDI + 0xa80);
    in_stack_fffffffffffffed0 =
         (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_20,(long)local_c0);
    (in_stack_fffffffffffffed0->super_TPZVec<double>)._vptr_TPZVec =
         (_func_int **)(dVar1 + (dVar2 * dVar3) / dVar5);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffed0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
		{
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,loc,xqsi); // gives the map (qsi,eta) to (x,y,z)
            
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            for (int i = 0; i < 3; i++) {
                result[i] = fxc[i] + xqsiLxc[i] * fR / norm;
            }
                
            
		}